

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_struct<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  detail *pdVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  detail *pdVar13;
  detail *pdVar14;
  string_view tag_00;
  string_view tags;
  detail *extraout_RDX;
  
  sVar3 = tag._len;
  pcVar4 = tag._ptr;
  uVar7 = 0;
  if (sVar3 != 0) {
    uVar7 = sVar3 - 1;
  }
  if (sVar3 == 0 || sVar3 - 1 == 0) {
    return;
  }
  uVar9 = 0;
  do {
    uVar1 = uVar9;
    if (pcVar4[uVar9] == '`') break;
    uVar9 = uVar9 + 1;
    uVar1 = uVar7;
  } while (uVar7 != uVar9);
  uVar9 = uVar1;
  if (uVar7 < uVar1) {
    uVar9 = uVar7;
  }
  lVar6 = uVar7 - uVar9;
  if (lVar6 == 0) {
    uVar7 = full_tag._len;
    pdVar14 = (detail *)full_tag._ptr;
    if (uVar1 == 0) {
      return;
    }
LAB_0015e08f:
    pdVar13 = pdVar14;
    uVar9 = uVar7;
    if (uVar9 == 0) {
      return;
    }
    pdVar14 = pdVar13;
    uVar7 = uVar9;
    do {
      uVar12 = 0;
LAB_0015e0a7:
      uVar10 = 0xffffffffffffffff;
      if (uVar7 == uVar12) goto LAB_0015e0da;
      if (pdVar14[uVar12] == *(detail *)(pcVar4 + uVar12)) goto code_r0x0015e0bd;
      pdVar14 = pdVar14 + 1;
      uVar7 = uVar7 - 1;
    } while( true );
  }
  pdVar5 = (detail *)(pcVar4 + uVar9);
  pdVar14 = pdVar5;
  goto LAB_0015dffd;
code_r0x0015e0bd:
  uVar12 = uVar12 + 1;
  if (uVar1 == uVar12) {
    if (pdVar14 != pdVar13 + uVar9) {
      uVar10 = (long)pdVar14 - (long)pdVar13;
    }
LAB_0015e0da:
    uVar12 = uVar10;
    if (uVar9 < uVar10) {
      uVar12 = uVar9;
    }
    uVar7 = uVar9 - uVar12;
    uVar11 = uVar1;
    if (uVar7 < uVar1) {
      uVar11 = uVar7;
    }
    uVar7 = uVar7 - uVar11;
    if (uVar7 == 0) {
      return;
    }
    if (pdVar13[uVar11 + uVar12] == (detail)0x7d) {
      return;
    }
    pdVar14 = pdVar13 + uVar11 + uVar12;
    if (pdVar13[uVar11 + uVar12] != (detail)0x60) goto LAB_0015e08f;
    if (uVar7 == 1) {
      return;
    }
    if (uVar9 <= uVar10) {
      uVar10 = uVar9;
    }
    uVar9 = uVar9 - uVar10;
    if (uVar9 <= uVar1) {
      uVar1 = uVar9;
    }
    lVar6 = 1;
    pdVar5 = (detail *)0x1;
    goto LAB_0015e14a;
  }
  goto LAB_0015e0a7;
LAB_0015e14a:
  do {
    if (pdVar13[lVar6 + uVar1 + uVar10] == (detail)0x7d) {
      pdVar5 = pdVar5 + -1;
      if (pdVar5 == (detail *)0x0) goto LAB_0015dffd;
    }
    else if (pdVar13[lVar6 + uVar1 + uVar10] == (detail)0x7b) {
      pdVar5 = pdVar5 + 1;
    }
    lVar6 = lVar6 + 1;
  } while (uVar9 - uVar1 != lVar6);
  lVar6 = uVar7 - 1;
  if (lVar6 == 0) {
    return;
  }
LAB_0015dffd:
  do {
    uVar7 = lVar6 - 1;
    if (uVar7 == 0) {
      uVar9 = 1;
    }
    else {
      uVar1 = 0;
      do {
        uVar9 = uVar1;
        if (pdVar14[uVar1 + 1] == (detail)0x27) break;
        uVar1 = uVar1 + 1;
        uVar9 = uVar7;
      } while (uVar7 != uVar1);
      uVar9 = uVar9 + 1;
    }
    if (uVar7 < uVar9) {
      uVar9 = uVar7;
    }
    pdVar13 = pdVar14 + uVar9 + 1;
    pcVar8 = (char *)(uVar7 - uVar9);
    tags._len = (size_t)pdVar5;
    tags._ptr = pcVar8;
    pcVar2 = (char *)tag_first_size(pdVar13,tags);
    pcVar4 = pcVar2;
    if (pcVar8 < pcVar2) {
      pcVar4 = pcVar8;
    }
    pdVar14 = pdVar13 + (long)pcVar4;
    tag_00._len = (size_t)pcVar2;
    tag_00._ptr = (char *)pdVar13;
    visit_impl<Visitor,std::ifstream>(full_tag,tag_00,visitor,istream,max_recursion);
    lVar6 = (long)pcVar8 - (long)pcVar4;
    pdVar5 = extraout_RDX;
    if (lVar6 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}